

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# terminal_input_parser.cpp
# Opt level: O1

Output * __thiscall ftxui::TerminalInputParser::ParseDCS(TerminalInputParser *this)

{
  uint uVar1;
  int iVar2;
  pointer pcVar3;
  Type TVar4;
  int iVar5;
  Output *in_RDI;
  ulong uVar6;
  
  iVar5 = this->position_;
  iVar2 = (int)(this->pending_)._M_string_length;
  uVar1 = iVar5 + 1;
  this->position_ = uVar1;
  TVar4 = UNCOMPLETED;
  if ((int)uVar1 < iVar2) {
    pcVar3 = (this->pending_)._M_dataplus._M_p;
    do {
      uVar6 = (ulong)uVar1;
      if (pcVar3[(int)uVar1] == '\x1b') {
        uVar6 = (long)iVar5 + 2;
        this->position_ = (int)uVar6;
        if (iVar2 <= (int)uVar6) break;
        if (pcVar3[uVar6] == '\\') {
          TVar4 = SPECIAL;
          break;
        }
      }
      iVar5 = (int)uVar6;
      uVar1 = iVar5 + 1;
      this->position_ = uVar1;
    } while ((int)uVar1 < iVar2);
  }
  in_RDI->type = TVar4;
  return in_RDI;
}

Assistant:

TerminalInputParser::Output TerminalInputParser::ParseDCS() {
  // Parse until the string terminator ST.
  while (1) {
    if (!Eat())
      return UNCOMPLETED;

    if (Current() != '\x1B')
      continue;

    if (!Eat())
      return UNCOMPLETED;

    if (Current() != '\\')
      continue;

    return SPECIAL;
  }
}